

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_inflate_handle_invalid_connection
              (nghttp2_session *session,nghttp2_frame *frame,int lib_error_code,char *reason)

{
  int iVar1;
  int rv;
  char *reason_local;
  int lib_error_code_local;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  session_local._4_4_ = session_handle_invalid_connection(session,frame,lib_error_code,reason);
  iVar1 = nghttp2_is_fatal(session_local._4_4_);
  if (iVar1 == 0) {
    session_local._4_4_ = -0x67;
  }
  return session_local._4_4_;
}

Assistant:

static int session_inflate_handle_invalid_connection(nghttp2_session *session,
                                                     nghttp2_frame *frame,
                                                     int lib_error_code,
                                                     const char *reason) {
  int rv;
  rv =
      session_handle_invalid_connection(session, frame, lib_error_code, reason);
  if (nghttp2_is_fatal(rv)) {
    return rv;
  }
  return NGHTTP2_ERR_IGN_HEADER_BLOCK;
}